

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QtPrivate::QCommonArrayOps<QByteArray>::
appendIteratorRange<QHash<QByteArray,QTzTimeZone>::key_iterator>
          (QCommonArrayOps<QByteArray> *this,key_iterator b,key_iterator e,
          IfIsForwardIterator<QHash<QByteArray,_QTzTimeZone>::key_iterator> param_3)

{
  qsizetype *pqVar1;
  byte bVar2;
  Entry *pEVar3;
  Data *pDVar4;
  QByteArray *pQVar5;
  ulong uVar6;
  Data<QHashPrivate::Node<QByteArray,_QTzTimeZone>_> *pDVar7;
  
  uVar6 = b.i.i.bucket;
  pDVar7 = b.i.i.d;
  if (uVar6 != e.i.i.bucket || pDVar7 != e.i.i.d) {
    pQVar5 = (this->super_Type).super_QGenericArrayOps<QByteArray>.
             super_QArrayDataPointer<QByteArray>.ptr +
             (this->super_Type).super_QGenericArrayOps<QByteArray>.
             super_QArrayDataPointer<QByteArray>.size;
    do {
      pEVar3 = pDVar7->spans[uVar6 >> 7].entries;
      bVar2 = pDVar7->spans[uVar6 >> 7].offsets[(uint)uVar6 & 0x7f];
      pDVar4 = *(Data **)pEVar3[bVar2].storage.data;
      (pQVar5->d).d = pDVar4;
      (pQVar5->d).ptr = *(char **)(pEVar3[bVar2].storage.data + 8);
      (pQVar5->d).size = *(qsizetype *)(pEVar3[bVar2].storage.data + 0x10);
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pqVar1 = &(this->super_Type).super_QGenericArrayOps<QByteArray>.
                super_QArrayDataPointer<QByteArray>.size;
      *pqVar1 = *pqVar1 + 1;
      pQVar5 = pQVar5 + 1;
      do {
        if (pDVar7->numBuckets - 1 == uVar6) {
          pDVar7 = (Data<QHashPrivate::Node<QByteArray,_QTzTimeZone>_> *)0x0;
          uVar6 = 0;
          break;
        }
        uVar6 = uVar6 + 1;
      } while (pDVar7->spans[uVar6 >> 7].offsets[(uint)uVar6 & 0x7f] == 0xff);
    } while (uVar6 != e.i.i.bucket || pDVar7 != e.i.i.d);
  }
  return;
}

Assistant:

bool operator==(iterator other) const noexcept
    { return d == other.d && bucket == other.bucket; }